

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_narrow.c
# Opt level: O0

TRef lj_opt_narrow_unm(jit_State *J,TRef rc,TValue *vc)

{
  IRRef1 IVar1;
  TRef TVar2;
  double *in_RDX;
  TRef in_ESI;
  jit_State *in_RDI;
  TValue *in_stack_ffffffffffffff78;
  GCstr *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined2 in_stack_ffffffffffffff8c;
  undefined2 in_stack_ffffffffffffff8e;
  cTValue *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffffa0;
  
  if ((in_ESI & 0x1f000000) == 0x4000000) {
    (in_RDI->fold).ins.field_0.ot = 0x588e;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0;
    in_ESI = lj_opt_fold((jit_State *)
                         CONCAT26(in_stack_ffffffffffffff8e,
                                  CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
    lj_strscan_num(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if ((in_ESI >> 0x18 & 0x1f) - 0xf < 5) {
    if ((int)*in_RDX != -0x80000000) {
      TVar2 = lj_ir_kint(in_RDI,CONCAT22(in_stack_ffffffffffffff8e,in_stack_ffffffffffffff8c));
      (in_RDI->fold).ins.field_0.ot = 0x3693;
      (in_RDI->fold).ins.field_0.op1 = (IRRef1)TVar2;
      (in_RDI->fold).ins.field_0.op2 = (IRRef1)in_ESI;
      TVar2 = lj_opt_fold((jit_State *)
                          CONCAT26(in_stack_ffffffffffffff8e,
                                   CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
      return TVar2;
    }
    (in_RDI->fold).ins.field_0.ot = 0x550e;
    (in_RDI->fold).ins.field_0.op1 = (IRRef1)in_ESI;
    (in_RDI->fold).ins.field_0.op2 = 0x1d3;
    in_ESI = lj_opt_fold((jit_State *)
                         CONCAT26(in_stack_ffffffffffffff8e,
                                  CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)));
  }
  IVar1 = (IRRef1)in_ESI;
  TVar2 = lj_ir_k64((jit_State *)CONCAT44(in_ESI,in_stack_ffffffffffffffa0),
                    (IROp)((ulong)in_RDX >> 0x20),in_stack_ffffffffffffff90);
  (in_RDI->fold).ins.field_0.ot = 0x2e0e;
  (in_RDI->fold).ins.field_0.op1 = IVar1;
  (in_RDI->fold).ins.field_0.op2 = (IRRef1)TVar2;
  TVar2 = lj_opt_fold((jit_State *)
                      CONCAT26(IVar1,CONCAT24(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)))
  ;
  return TVar2;
}

Assistant:

TRef lj_opt_narrow_unm(jit_State *J, TRef rc, TValue *vc)
{
  if (tref_isstr(rc)) {
    rc = emitir(IRTG(IR_STRTO, IRT_NUM), rc, 0);
    lj_strscan_num(strV(vc), vc);
  }
  if (tref_isinteger(rc)) {
    if ((uint32_t)numberVint(vc) != 0x80000000u)
      return emitir(IRTGI(IR_SUBOV), lj_ir_kint(J, 0), rc);
    rc = emitir(IRTN(IR_CONV), rc, IRCONV_NUM_INT);
  }
  return emitir(IRTN(IR_NEG), rc, lj_ir_knum_neg(J));
}